

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharType.cpp
# Opt level: O0

void __thiscall hdc::CharType::CharType(CharType *this,Token *token)

{
  Token *token_local;
  CharType *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_002201a8;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_CHAR_TYPE;
  return;
}

Assistant:

CharType::CharType(Token& token) {
    this->token = token;
    this->kind = AST_CHAR_TYPE;
}